

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BarrierCase::iterate(BarrierCase *this)

{
  RenderContext *rCtx;
  bool bVar1;
  int i;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  char *description;
  value_type_conflict2 *__val;
  RandomViewport viewport;
  Surface rendered;
  VertexArrayBinding attrBindings [1];
  RandomViewport local_118;
  ConstPixelBufferAccess local_108;
  Surface local_e0;
  undefined1 local_c8 [8];
  long *local_c0;
  void *local_b8;
  long local_b0 [2];
  int local_a0;
  TestLog *local_98;
  TextureFormat local_90;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  int local_60;
  VertexArrayPointer local_58;
  undefined4 extraout_var_00;
  
  local_98 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  rCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*rCtx->_vptr_RenderContext[4])(rCtx);
  dVar3 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_118,(RenderTarget *)CONCAT44(extraout_var,iVar2),0x100,0x100,dVar3);
  dVar3 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar2 = (*rCtx->_vptr_RenderContext[3])(rCtx);
  lVar4 = CONCAT44(extraout_var_00,iVar2);
  (**(code **)(lVar4 + 0x1a00))(local_118.x,local_118.y,local_118.width,local_118.height);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar4 + 0x1680))(dVar3);
  puVar5 = (undefined8 *)operator_new(0x80);
  *puVar5 = 0;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[6] = 0;
  puVar5[7] = 0;
  puVar5[8] = 0;
  puVar5[9] = 0;
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0xc] = 0;
  puVar5[0xd] = 0;
  puVar5[0xe] = 0;
  puVar5[0xf] = 0;
  lVar6 = 0;
  do {
    *(float *)((long)puVar5 + lVar6 * 4) = (float)(int)lVar6 / 31.0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  (**(code **)(lVar4 + 0xfd8))(0x8e72,0x20);
  (**(code **)(lVar4 + 0x188))(0x4000);
  local_108.m_format = (TextureFormat)(local_108.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in_v_attr","");
  local_c8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,local_108.m_format,
             local_108.m_size.m_data._0_8_ + (long)local_108.m_format);
  local_a0 = 0;
  local_88._0_4_ = local_c8._0_4_;
  local_80._M_p = (pointer)&local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,local_c0,(long)local_b8 + (long)local_c0);
  local_60 = local_a0;
  local_58.componentType = VTX_COMP_FLOAT;
  local_58.convert = VTX_COMP_CONVERT_NONE;
  local_58.numComponents = 1;
  local_58.numElements = 0x20;
  local_58.stride = 0;
  local_58.data = puVar5;
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  if (local_108.m_format != (TextureFormat)(local_108.m_size.m_data + 2)) {
    operator_delete((void *)local_108.m_format,local_108._16_8_ + 1);
  }
  local_c8._0_4_ = RGB;
  local_c8._4_4_ = UNSIGNED_INT24;
  local_c0 = (long *)CONCAT44(local_c0._4_4_,INDEXTYPE_LAST);
  local_b8 = (void *)0x0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,dVar3,1,(VertexArrayBinding *)local_88,
            (PrimitiveList *)local_c8,(DrawUtilCallback *)0x0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0xd9f);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_p != &local_70) {
    operator_delete(local_80._M_p,local_70._M_allocated_capacity + 1);
  }
  operator_delete(puVar5,0x80);
  getPixels(&local_e0,rCtx,local_118.x,local_118.y,local_118.width,local_118.height);
  getPNG((TextureLevel *)local_88,
         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_curArchive,
         &this->m_referenceImagePath);
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_c8,(TextureLevel *)local_88);
  local_90.order = RGBA;
  local_90.type = UNORM_INT8;
  if ((void *)local_e0.m_pixels.m_cap != (void *)0x0) {
    local_e0.m_pixels.m_cap = (size_t)local_e0.m_pixels.m_ptr;
  }
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_108,&local_90,local_e0.m_width,local_e0.m_height,1,
             (void *)local_e0.m_pixels.m_cap);
  bVar1 = tcu::fuzzyCompare(local_98,"ImageComparison","Image Comparison",
                            (ConstPixelBufferAccess *)local_c8,&local_108,0.02,COMPARE_LOG_RESULT);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_88);
  tcu::Surface::~Surface(&local_e0);
  return STOP;
}

Assistant:

BarrierCase::IterateResult BarrierCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	{
		vector<float> attributeData(NUM_VERTICES);

		for (int i = 0; i < NUM_VERTICES; i++)
			attributeData[i] = (float)i / (float)(NUM_VERTICES-1);

		gl.patchParameteri(GL_PATCH_VERTICES, NUM_VERTICES);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_attr", 1, (int)attributeData.size(), 0, &attributeData[0])
		};

		glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches(NUM_VERTICES));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
		const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath);
		const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

		m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image comparison failed");
		return STOP;
	}
}